

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_analysis_nodes.h
# Opt level: O3

void __thiscall spvtools::opt::SEMultiplyNode::~SEMultiplyNode(SEMultiplyNode *this)

{
  pointer ppSVar1;
  
  (this->super_SENode)._vptr_SENode = (_func_int **)&PTR___cxa_pure_virtual_003dfd40;
  ppSVar1 = (this->super_SENode).children_.
            super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppSVar1 != (pointer)0x0) {
    operator_delete(ppSVar1,(long)(this->super_SENode).children_.
                                  super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppSVar1
                   );
  }
  operator_delete(this,0x30);
  return;
}

Assistant:

explicit SEMultiplyNode(ScalarEvolutionAnalysis* parent_analysis)
      : SENode(parent_analysis) {}